

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O1

int mqtt_client_publish(MQTT_CLIENT_HANDLE handle,MQTT_MESSAGE_HANDLE msgHandle)

{
  _Bool duplicateMsg;
  _Bool serverRetain;
  uint16_t packetId;
  QOS_VALUE qosValue;
  int iVar1;
  LOGGER_LOG p_Var2;
  APP_PAYLOAD *pAVar3;
  char *topicName;
  BUFFER_HANDLE handle_00;
  size_t length;
  uchar *data;
  STRING_HANDLE local_38;
  
  if (handle == (MQTT_CLIENT_HANDLE)0x0 || msgHandle == (MQTT_MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x47a;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                ,"mqtt_client_publish",0x479,1,
                "Invalid parameter specified mqtt_client: %p, msgHandle: %p",handle,msgHandle);
    }
  }
  else {
    pAVar3 = mqttmessage_getApplicationMsg(msgHandle);
    if (pAVar3 == (APP_PAYLOAD *)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x484;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                  ,"mqtt_client_publish",0x483,1,"Error: mqttmessage_getApplicationMsg failed");
      }
    }
    else {
      if ((handle->mqtt_flags & 1) == 0) {
        local_38 = (STRING_HANDLE)0x0;
      }
      else {
        local_38 = STRING_new();
      }
      qosValue = mqttmessage_getQosType(msgHandle);
      duplicateMsg = mqttmessage_getIsDuplicateMsg(msgHandle);
      serverRetain = mqttmessage_getIsRetained(msgHandle);
      packetId = mqttmessage_getPacketId(msgHandle);
      topicName = mqttmessage_getTopicName(msgHandle);
      handle_00 = mqtt_codec_publish(qosValue,duplicateMsg,serverRetain,packetId,topicName,
                                     pAVar3->message,pAVar3->length,local_38);
      if (handle_00 == (BUFFER_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x494;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                    ,"mqtt_client_publish",0x493,1,"Error: mqtt_codec_publish failed");
        }
      }
      else {
        handle->packetState = PUBLISH_TYPE;
        length = BUFFER_length(handle_00);
        data = BUFFER_u_char(handle_00);
        iVar1 = sendPacketItem(handle,data,length);
        if (iVar1 == 0) {
          log_outgoing_trace(handle,local_38);
          iVar1 = 0;
        }
        else {
          p_Var2 = xlogging_get_log_function();
          iVar1 = 0x4a0;
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                      ,"mqtt_client_publish",0x49f,1,"Error: mqtt_client_publish send failed");
          }
        }
        BUFFER_delete(handle_00);
      }
      if (local_38 != (STRING_HANDLE)0x0) {
        STRING_delete(local_38);
      }
    }
  }
  return iVar1;
}

Assistant:

int mqtt_client_publish(MQTT_CLIENT_HANDLE handle, MQTT_MESSAGE_HANDLE msgHandle)
{
    int result;
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)handle;
    if (mqtt_client == NULL || msgHandle == NULL)
    {
        /*Codes_SRS_MQTT_CLIENT_07_019: [If one of the parameters handle or msgHandle is NULL then mqtt_client_publish shall return a non-zero value.]*/
        LogError("Invalid parameter specified mqtt_client: %p, msgHandle: %p", mqtt_client, msgHandle);
        result = MU_FAILURE;
    }
    else
    {
        /*Codes_SRS_MQTT_CLIENT_07_021: [mqtt_client_publish shall get the message information from the MQTT_MESSAGE_HANDLE.]*/
        const APP_PAYLOAD* payload = mqttmessage_getApplicationMsg(msgHandle);
        if (payload == NULL)
        {
            /*Codes_SRS_MQTT_CLIENT_07_020: [If any failure is encountered then mqtt_client_unsubscribe shall return a non-zero value.]*/
            LogError("Error: mqttmessage_getApplicationMsg failed");
            result = MU_FAILURE;
        }
        else
        {
            STRING_HANDLE trace_log = construct_trace_log_handle(mqtt_client);

            QOS_VALUE qos = mqttmessage_getQosType(msgHandle);
            bool isDuplicate = mqttmessage_getIsDuplicateMsg(msgHandle);
            bool isRetained = mqttmessage_getIsRetained(msgHandle);
            uint16_t packetId = mqttmessage_getPacketId(msgHandle);
            const char* topicName = mqttmessage_getTopicName(msgHandle);
            BUFFER_HANDLE publishPacket = mqtt_codec_publish(qos, isDuplicate, isRetained, packetId, topicName, payload->message, payload->length, trace_log);
            if (publishPacket == NULL)
            {
                /*Codes_SRS_MQTT_CLIENT_07_020: [If any failure is encountered then mqtt_client_unsubscribe shall return a non-zero value.]*/
                LogError("Error: mqtt_codec_publish failed");
                result = MU_FAILURE;
            }
            else
            {
                mqtt_client->packetState = PUBLISH_TYPE;

                /*Codes_SRS_MQTT_CLIENT_07_022: [On success mqtt_client_publish shall send the MQTT SUBCRIBE packet to the endpoint.]*/
                size_t size = BUFFER_length(publishPacket);
                if (sendPacketItem(mqtt_client, BUFFER_u_char(publishPacket), size) != 0)
                {
                    /*Codes_SRS_MQTT_CLIENT_07_020: [If any failure is encountered then mqtt_client_unsubscribe shall return a non-zero value.]*/
                    LogError("Error: mqtt_client_publish send failed");
                    result = MU_FAILURE;
                }
                else
                {
                    log_outgoing_trace(mqtt_client, trace_log);
                    result = 0;
                }
                BUFFER_delete(publishPacket);
            }
            if (trace_log != NULL)
            {
                STRING_delete(trace_log);
            }
        }
    }
    return result;
}